

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab.cpp
# Opt level: O2

void __thiscall cab::update_position(cab *this,node_type position)

{
  pointer prVar1;
  node_type nVar2;
  uint32_t uVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  cab_manager::update_cab(this->_cab_manager,this->_id,this->_position,position);
  this->_position = position;
  lVar4 = 0;
  for (uVar5 = 0;
      prVar1 = (this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)prVar1 >> 4);
      uVar5 = uVar5 + 1) {
    nVar2 = request::src((request *)(&prVar1->_src + lVar4));
    if (nVar2 == position) {
      uVar3 = request::passengers((request *)
                                  (&((this->_requests).
                                     super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                     super__Vector_impl_data._M_start)->_src + lVar4));
      this->_passengers = this->_passengers + uVar3;
      request::pick_up((request *)
                       (&((this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                          _M_impl.super__Vector_impl_data._M_start)->_src + lVar4));
    }
    nVar2 = request::dst((request *)
                         (&((this->_requests).super__Vector_base<request,_std::allocator<request>_>.
                            _M_impl.super__Vector_impl_data._M_start)->_src + lVar4));
    if (nVar2 == position) {
      uVar3 = request::passengers((request *)
                                  (&((this->_requests).
                                     super__Vector_base<request,_std::allocator<request>_>._M_impl.
                                     super__Vector_impl_data._M_start)->_src + lVar4));
      this->_passengers = this->_passengers - uVar3;
      std::vector<request,_std::allocator<request>_>::erase
                (&this->_requests,
                 (request *)
                 (&((this->_requests).super__Vector_base<request,_std::allocator<request>_>._M_impl.
                    super__Vector_impl_data._M_start)->_src + lVar4));
    }
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void cab::update_position(node_type position)
{
    _cab_manager->update_cab(_id, _position, position);
    _position = position;
    for(std::size_t i = 0; i < _requests.size(); ++i)
    {
        if(_requests[i].src() == position)
        {
            _passengers += _requests[i].passengers();
            _requests[i].pick_up();
        }

        if(_requests[i].dst() == position)
        {
            _passengers -= _requests[i].passengers();
            _requests.erase(_requests.begin() + i);
        }
    }
}